

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O3

int c1fgkf_(int *ido,int *ip,int *l1,int *lid,int *na,double *cc,double *cc1,int *in1,double *ch,
           double *ch1,int *in2,double *wa)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  double *pdVar11;
  double *pdVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  double *pdVar23;
  double *pdVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  int iVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  double *pdVar32;
  double *pdVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  double dVar41;
  ulong local_e8;
  double *local_d8;
  double *local_d0;
  
  uVar4 = *ido;
  uVar5 = *ip;
  lVar36 = (long)(int)uVar5;
  uVar29 = ~(uVar5 * uVar4);
  iVar18 = *in1;
  lVar34 = (long)iVar18;
  iVar6 = *lid;
  lVar30 = (long)iVar6;
  uVar13 = iVar6 + 1;
  iVar7 = *in2;
  lVar35 = (long)iVar7;
  uVar40 = (ulong)uVar13;
  iVar8 = *l1;
  lVar19 = (long)iVar8;
  uVar15 = uVar5 + 1;
  lVar25 = (long)(int)~(uVar13 * iVar18);
  lVar38 = (long)(int)~(iVar7 * uVar13);
  uVar27 = (ulong)uVar4;
  if (0 < lVar30) {
    pdVar11 = ch1 + (lVar30 + 1) * lVar35 + lVar38 + 2;
    pdVar23 = cc1 + (lVar30 + 1) * lVar34 + lVar25 + 2;
    lVar31 = uVar40 - 1;
    do {
      pdVar11[-1] = pdVar23[-1];
      *pdVar11 = *pdVar23;
      pdVar11 = pdVar11 + lVar35;
      pdVar23 = pdVar23 + lVar34;
      lVar31 = lVar31 + -1;
    } while (lVar31 != 0);
  }
  uVar13 = uVar5 - 1;
  uVar9 = uVar5 + 2;
  iVar28 = (int)((uVar5 - ((int)uVar15 >> 0x1f)) + 1) >> 1;
  if (2 < (int)uVar5) {
    uVar10 = (ulong)uVar9;
    iVar14 = 2;
    if (2 < iVar28) {
      iVar14 = iVar28;
    }
    lVar31 = (uVar10 - 2) * lVar30 + 1;
    pdVar23 = ch1 + lVar31 * lVar35 + 2;
    lVar20 = lVar30 * lVar35;
    pdVar24 = cc1 + lVar31 * lVar34 + lVar25;
    lVar21 = lVar30 * lVar34;
    lVar31 = lVar30 * 2 + 1;
    lVar22 = lVar31 * lVar35;
    pdVar11 = ch1 + lVar22 + 2;
    lVar31 = lVar31 * lVar34;
    pdVar32 = cc1 + lVar31 + lVar25;
    uVar39 = 2;
    do {
      if (0 < iVar6) {
        lVar37 = 0x10;
        lVar26 = uVar40 - 1;
        pdVar12 = pdVar23;
        pdVar33 = pdVar11;
        do {
          pdVar33[lVar38 + -1] =
               *(double *)((long)pdVar32 + lVar37 + -8) + *(double *)((long)pdVar24 + lVar37 + -8);
          pdVar12[lVar38 + -1] =
               *(double *)((long)pdVar32 + lVar37 + -8) - *(double *)((long)pdVar24 + lVar37 + -8);
          pdVar33[lVar38] =
               *(double *)((long)pdVar32 + lVar37) + *(double *)((long)pdVar24 + lVar37);
          pdVar12[lVar38] =
               *(double *)((long)pdVar32 + lVar37) - *(double *)((long)pdVar24 + lVar37);
          pdVar12 = pdVar12 + lVar35;
          lVar37 = lVar37 + lVar34 * 8;
          pdVar33 = pdVar33 + lVar35;
          lVar26 = lVar26 + -1;
        } while (lVar26 != 0);
      }
      uVar39 = uVar39 + 1;
      pdVar23 = pdVar23 + -lVar20;
      pdVar24 = pdVar24 + -lVar21;
      pdVar11 = pdVar11 + lVar20;
      pdVar32 = pdVar32 + lVar21;
    } while (uVar39 != iVar14 + 1);
    if (2 < (int)uVar5) {
      iVar14 = 2;
      if (2 < iVar28) {
        iVar14 = iVar28;
      }
      pdVar11 = ch1 + lVar22 + lVar38 + 2;
      uVar39 = 2;
      do {
        lVar22 = uVar40 - 1;
        pdVar23 = pdVar11;
        pdVar24 = cc1 + (lVar30 + 1) * lVar34 + lVar25 + 2;
        if (0 < iVar6) {
          do {
            pdVar24[-1] = pdVar23[-1] + pdVar24[-1];
            *pdVar24 = *pdVar23 + *pdVar24;
            pdVar24 = pdVar24 + lVar34;
            pdVar23 = pdVar23 + lVar35;
            lVar22 = lVar22 + -1;
          } while (lVar22 != 0);
        }
        uVar39 = uVar39 + 1;
        pdVar11 = pdVar11 + lVar20;
      } while (uVar39 != iVar14 + 1);
      if (2 < (int)uVar5) {
        iVar14 = 3;
        if (3 < iVar28) {
          iVar14 = iVar28;
        }
        iVar16 = 2;
        if (2 < iVar28) {
          iVar16 = iVar28;
        }
        lVar22 = ((uVar10 - 2) * lVar30 + 1) * lVar34;
        pdVar11 = cc1 + lVar22 + lVar25;
        pdVar23 = cc1 + lVar31 + lVar25;
        local_d0 = cc1 + lVar22 + 2;
        local_d8 = cc1 + lVar31 + 2;
        local_e8 = 2;
        do {
          if (0 < iVar6) {
            lVar22 = (uVar13 + local_e8 + -1) * (long)(int)uVar4;
            lVar26 = ((long)(int)(uVar13 * 2) + local_e8 + -1) * (long)(int)uVar4;
            lVar37 = 0x10;
            pdVar24 = ch1 + (lVar30 + 1) * lVar35 + 2;
            lVar31 = uVar40 - 1;
            pdVar32 = ch1 + ((long)(int)(iVar6 * uVar5) + 1) * lVar35 + 2;
            pdVar12 = ch1 + ((long)(iVar6 * 2) + 1) * lVar35 + 2;
            do {
              *(double *)((long)pdVar23 + lVar37 + -8) =
                   wa[(long)(int)uVar29 + lVar22 + 1] * pdVar12[lVar38 + -1] + pdVar24[lVar38 + -1];
              *(double *)((long)pdVar11 + lVar37 + -8) =
                   -wa[(long)(int)uVar29 + lVar26 + 1] * pdVar32[lVar38 + -1];
              *(double *)((long)pdVar23 + lVar37) =
                   wa[(long)(int)uVar29 + lVar22 + 1] * pdVar12[lVar38] + pdVar24[lVar38];
              *(double *)((long)pdVar11 + lVar37) =
                   -wa[(long)(int)uVar29 + lVar26 + 1] * pdVar32[lVar38];
              lVar37 = lVar37 + lVar34 * 8;
              pdVar32 = pdVar32 + lVar35;
              pdVar12 = pdVar12 + lVar35;
              pdVar24 = pdVar24 + lVar35;
              lVar31 = lVar31 + -1;
            } while (lVar31 != 0);
          }
          if (4 < uVar5) {
            uVar39 = 3;
            pdVar24 = ch1 + ((uVar10 - 3) * lVar30 + 1) * lVar35 + lVar38;
            pdVar32 = ch1 + (lVar30 * 3 + 1) * lVar35 + lVar38;
            do {
              iVar17 = (((int)uVar39 + -1) * ((int)local_e8 + -1)) % (int)uVar5;
              if (0 < iVar6) {
                dVar41 = wa[(long)(int)uVar29 + (long)(int)((uVar13 + iVar17) * uVar4) + 1];
                dVar1 = wa[(long)(int)uVar29 + (long)(int)((iVar17 + uVar13 * 2) * uVar4) + 1];
                lVar22 = 0x10;
                pdVar12 = local_d0;
                lVar31 = uVar40 - 1;
                pdVar33 = local_d8;
                do {
                  pdVar33[lVar25 + -1] =
                       *(double *)((long)pdVar32 + lVar22 + -8) * dVar41 + pdVar33[lVar25 + -1];
                  pdVar12[lVar25 + -1] =
                       *(double *)((long)pdVar24 + lVar22 + -8) * -dVar1 + pdVar12[lVar25 + -1];
                  pdVar33[lVar25] = *(double *)((long)pdVar32 + lVar22) * dVar41 + pdVar33[lVar25];
                  pdVar12[lVar25] = *(double *)((long)pdVar24 + lVar22) * -dVar1 + pdVar12[lVar25];
                  pdVar12 = pdVar12 + lVar34;
                  lVar22 = lVar22 + lVar35 * 8;
                  pdVar33 = pdVar33 + lVar34;
                  lVar31 = lVar31 + -1;
                } while (lVar31 != 0);
              }
              uVar39 = uVar39 + 1;
              pdVar24 = pdVar24 + -lVar20;
              pdVar32 = pdVar32 + lVar20;
            } while (uVar39 != iVar14 + 1);
          }
          local_e8 = local_e8 + 1;
          pdVar11 = pdVar11 + -lVar21;
          pdVar23 = pdVar23 + lVar21;
          local_d0 = local_d0 + -lVar21;
          local_d8 = local_d8 + lVar21;
        } while (local_e8 != iVar16 + 1);
      }
    }
  }
  if ((int)uVar4 < 2) {
    dVar41 = 1.0 / (double)(int)(iVar8 * uVar5);
    if (*na == 1) {
      if (0 < iVar6) {
        pdVar11 = ch1 + (lVar30 + 1) * lVar35 + lVar38 + 2;
        pdVar23 = cc1 + (lVar30 + 1) * lVar34 + lVar25 + 2;
        lVar19 = uVar40 - 1;
        do {
          pdVar11[-1] = pdVar23[-1] * dVar41;
          *pdVar11 = *pdVar23 * dVar41;
          pdVar11 = pdVar11 + lVar35;
          pdVar23 = pdVar23 + lVar34;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
      }
      if (2 < (int)uVar5) {
        iVar18 = 2;
        if (2 < iVar28) {
          iVar18 = iVar28;
        }
        lVar19 = ((ulong)uVar9 - 2) * lVar30 + 1;
        pdVar11 = ch1 + lVar19 * lVar35 + 2;
        pdVar23 = cc1 + lVar19 * lVar34 + lVar25;
        lVar19 = lVar30 * 2 + 1;
        pdVar24 = ch1 + lVar19 * lVar35 + 2;
        pdVar32 = cc1 + lVar19 * lVar34 + lVar25;
        uVar27 = 2;
        do {
          if (0 < iVar6) {
            lVar25 = 0x10;
            pdVar12 = pdVar11;
            pdVar33 = pdVar24;
            lVar19 = uVar40 - 1;
            do {
              pdVar33[lVar38 + -1] =
                   (*(double *)((long)pdVar32 + lVar25 + -8) - *(double *)((long)pdVar23 + lVar25))
                   * dVar41;
              pdVar33[lVar38] =
                   (*(double *)((long)pdVar32 + lVar25) + *(double *)((long)pdVar23 + lVar25 + -8))
                   * dVar41;
              pdVar12[lVar38 + -1] =
                   (*(double *)((long)pdVar32 + lVar25 + -8) + *(double *)((long)pdVar23 + lVar25))
                   * dVar41;
              pdVar12[lVar38] =
                   (*(double *)((long)pdVar32 + lVar25) - *(double *)((long)pdVar23 + lVar25 + -8))
                   * dVar41;
              pdVar12 = pdVar12 + lVar35;
              lVar25 = lVar25 + lVar34 * 8;
              pdVar33 = pdVar33 + lVar35;
              lVar19 = lVar19 + -1;
            } while (lVar19 != 0);
          }
          uVar27 = uVar27 + 1;
          pdVar11 = pdVar11 + -(lVar30 * lVar35);
          pdVar23 = pdVar23 + -(lVar30 * lVar34);
          pdVar24 = pdVar24 + lVar30 * lVar35;
          pdVar32 = pdVar32 + lVar30 * lVar34;
        } while (uVar27 != iVar18 + 1);
      }
    }
    else {
      if (0 < iVar6) {
        pdVar11 = cc1 + (lVar30 + 1) * lVar34 + lVar25 + 1;
        lVar19 = uVar40 - 1;
        do {
          *pdVar11 = *pdVar11 * dVar41;
          pdVar11[1] = pdVar11[1] * dVar41;
          pdVar11 = pdVar11 + lVar34;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
      }
      if (2 < (int)uVar5) {
        iVar18 = 2;
        if (2 < iVar28) {
          iVar18 = iVar28;
        }
        pdVar11 = cc1 + (((ulong)uVar9 - 2) * lVar30 + 1) * lVar34 + lVar25 + 2;
        pdVar23 = cc1 + (lVar30 * 2 + 1) * lVar34 + lVar25 + 2;
        uVar27 = 2;
        do {
          if (0 < iVar6) {
            lVar25 = 0;
            lVar19 = uVar40 - 1;
            do {
              dVar1 = *(double *)((long)pdVar11 + lVar25);
              dVar2 = *(double *)((long)pdVar23 + lVar25 + -8);
              *(double *)((long)pdVar23 + lVar25 + -8) = (dVar2 - dVar1) * dVar41;
              dVar3 = *(double *)((long)pdVar11 + lVar25 + -8);
              *(double *)((long)pdVar11 + lVar25) =
                   (*(double *)((long)pdVar23 + lVar25) - dVar3) * dVar41;
              *(double *)((long)pdVar23 + lVar25) =
                   (dVar3 + *(double *)((long)pdVar23 + lVar25)) * dVar41;
              *(double *)((long)pdVar11 + lVar25 + -8) = (dVar2 + dVar1) * dVar41;
              lVar25 = lVar25 + lVar34 * 8;
              lVar19 = lVar19 + -1;
            } while (lVar19 != 0);
          }
          uVar27 = uVar27 + 1;
          pdVar11 = pdVar11 + -(lVar30 * lVar34);
          pdVar23 = pdVar23 + lVar30 * lVar34;
        } while (uVar27 != iVar18 + 1);
      }
    }
  }
  else {
    if (0 < iVar6) {
      pdVar11 = ch1 + (lVar30 + 1) * lVar35 + lVar38 + 2;
      pdVar23 = cc1 + (lVar30 + 1) * lVar34 + lVar25 + 2;
      lVar31 = uVar40 - 1;
      do {
        pdVar11[-1] = pdVar23[-1];
        *pdVar11 = *pdVar23;
        pdVar11 = pdVar11 + lVar35;
        pdVar23 = pdVar23 + lVar34;
        lVar31 = lVar31 + -1;
      } while (lVar31 != 0);
    }
    lVar20 = (long)(int)(~(iVar8 * uVar15) * iVar18 + -1);
    lVar31 = (long)(int)(~((uVar4 + 1) * iVar8) * iVar7 + -1);
    if (2 < (int)uVar5) {
      iVar18 = 2;
      if (2 < iVar28) {
        iVar18 = iVar28;
      }
      lVar21 = ((ulong)uVar9 - 2) * lVar30 + 1;
      pdVar23 = ch1 + lVar21 * lVar35 + 2;
      pdVar24 = cc1 + lVar21 * lVar34 + lVar25;
      lVar21 = lVar30 * 2 + 1;
      pdVar11 = ch1 + lVar21 * lVar35 + 2;
      pdVar32 = cc1 + lVar21 * lVar34 + lVar25;
      uVar10 = 2;
      do {
        if (0 < iVar6) {
          lVar21 = 0x10;
          pdVar12 = pdVar23;
          lVar25 = uVar40 - 1;
          pdVar33 = pdVar11;
          do {
            pdVar33[lVar38 + -1] =
                 *(double *)((long)pdVar32 + lVar21 + -8) - *(double *)((long)pdVar24 + lVar21);
            pdVar33[lVar38] =
                 *(double *)((long)pdVar32 + lVar21) + *(double *)((long)pdVar24 + lVar21 + -8);
            pdVar12[lVar38 + -1] =
                 *(double *)((long)pdVar32 + lVar21 + -8) + *(double *)((long)pdVar24 + lVar21);
            pdVar12[lVar38] =
                 *(double *)((long)pdVar32 + lVar21) - *(double *)((long)pdVar24 + lVar21 + -8);
            pdVar12 = pdVar12 + lVar35;
            lVar21 = lVar21 + lVar34 * 8;
            pdVar33 = pdVar33 + lVar35;
            lVar25 = lVar25 + -1;
          } while (lVar25 != 0);
        }
        uVar10 = uVar10 + 1;
        pdVar23 = pdVar23 + -(lVar30 * lVar35);
        pdVar24 = pdVar24 + -(lVar30 * lVar34);
        pdVar11 = pdVar11 + lVar30 * lVar35;
        pdVar32 = pdVar32 + lVar30 * lVar34;
      } while (uVar10 != iVar18 + 1);
    }
    pdVar11 = cc + ((lVar36 + 1) * lVar19 + 1) * lVar34 + lVar20 + 2;
    pdVar23 = ch + ((uVar27 + 1) * lVar19 + 1) * lVar35 + lVar31 + 2;
    lVar25 = lVar19 * lVar35;
    lVar30 = 1;
    do {
      lVar38 = (ulong)(iVar8 + 1) - 1;
      pdVar24 = pdVar23;
      pdVar32 = pdVar11;
      if (0 < iVar8) {
        do {
          pdVar32[-1] = pdVar24[-1];
          *pdVar32 = *pdVar24;
          pdVar32 = pdVar32 + lVar34;
          pdVar24 = pdVar24 + lVar35;
          lVar38 = lVar38 + -1;
        } while (lVar38 != 0);
      }
      lVar30 = lVar30 + 1;
      pdVar11 = pdVar11 + lVar36 * lVar19 * lVar34;
      pdVar23 = pdVar23 + lVar25;
    } while (lVar30 != uVar27 + 1);
    if (1 < (int)uVar5) {
      pdVar11 = cc + ((lVar36 + 2) * lVar19 + 1) * lVar34 + lVar20 + 2;
      lVar30 = lVar19 * lVar34;
      pdVar23 = ch + ((uVar27 * 2 + 1) * lVar19 + 1) * lVar35 + lVar31 + 2;
      uVar40 = 2;
      do {
        lVar38 = (ulong)(iVar8 + 1) - 1;
        pdVar24 = pdVar23;
        pdVar32 = pdVar11;
        if (0 < iVar8) {
          do {
            pdVar32[-1] = pdVar24[-1];
            *pdVar32 = *pdVar24;
            pdVar32 = pdVar32 + lVar34;
            pdVar24 = pdVar24 + lVar35;
            lVar38 = lVar38 + -1;
          } while (lVar38 != 0);
        }
        uVar40 = uVar40 + 1;
        pdVar11 = pdVar11 + lVar30;
        pdVar23 = pdVar23 + lVar25 * uVar27;
      } while (uVar40 != uVar15);
      if (1 < (int)uVar5) {
        pdVar23 = cc + ((lVar36 * 2 + 2) * lVar19 + 1) * lVar34 + lVar20 + 2;
        pdVar11 = ch + ((uVar27 * 2 + 2) * lVar19 + 1) * lVar35 + lVar31 + 2;
        uVar40 = 2;
        do {
          lVar19 = (uVar13 + uVar40 + -1) * uVar27;
          lVar38 = ((long)(int)(uVar13 * 2) + uVar40 + -1) * uVar27;
          uVar10 = 2;
          pdVar24 = pdVar23;
          pdVar32 = pdVar11;
          do {
            pdVar12 = pdVar32;
            pdVar33 = pdVar24;
            lVar31 = (ulong)(iVar8 + 1) - 1;
            if (0 < iVar8) {
              do {
                pdVar33[-1] = wa[(long)(int)uVar29 + lVar19 + uVar10] * pdVar12[-1] +
                              wa[(long)(int)uVar29 + lVar38 + uVar10] * *pdVar12;
                *pdVar33 = wa[(long)(int)uVar29 + lVar19 + uVar10] * *pdVar12 -
                           pdVar12[-1] * wa[(long)(int)uVar29 + lVar38 + uVar10];
                lVar31 = lVar31 + -1;
                pdVar12 = pdVar12 + lVar35;
                pdVar33 = pdVar33 + lVar34;
              } while (lVar31 != 0);
            }
            uVar10 = uVar10 + 1;
            pdVar24 = pdVar24 + lVar30 * lVar36;
            pdVar32 = pdVar32 + lVar25;
          } while (uVar10 != uVar4 + 1);
          uVar40 = uVar40 + 1;
          pdVar23 = pdVar23 + lVar30;
          pdVar11 = pdVar11 + lVar25 * uVar27;
        } while (uVar40 != uVar15);
      }
    }
  }
  return 0;
}

Assistant:

int c1fgkf_(int *ido, int *ip, int *l1, int *
	lid, int *na, fft_real_t *cc, fft_real_t *cc1, int *in1, fft_real_t *ch, fft_real_t *
	ch1, int *in2, fft_real_t *wa)
{
    /* System generated locals */
    int ch_dim1, ch_dim2, ch_dim3, ch_offset, cc_dim1, cc_dim2, cc_dim3,
	    cc_offset, cc1_dim1, cc1_dim2, cc1_offset, ch1_dim1, ch1_dim2,
	    ch1_offset, wa_dim1, wa_dim2, wa_offset, i__1, i__2, i__3;

    /* Local variables */
     int i__, j, k, l, jc, lc, ki;
     fft_real_t sn, wai, war;
     int ipp2, idlj, ipph;
     fft_real_t chold1, chold2;


/* FFTPACK 5.1 auxiliary routine */

    /* Parameter adjustments */
    wa_dim1 = *ido;
    wa_dim2 = *ip - 1;
    wa_offset = 1 + wa_dim1 * (1 + wa_dim2);
    wa -= wa_offset;
    cc1_dim1 = *in1;
    cc1_dim2 = *lid;
    cc1_offset = 1 + cc1_dim1 * (1 + cc1_dim2);
    cc1 -= cc1_offset;
    cc_dim1 = *in1;
    cc_dim2 = *l1;
    cc_dim3 = *ip;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch1_dim1 = *in2;
    ch1_dim2 = *lid;
    ch1_offset = 1 + ch1_dim1 * (1 + ch1_dim2);
    ch1 -= ch1_offset;
    ch_dim1 = *in2;
    ch_dim2 = *l1;
    ch_dim3 = *ido;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * (1 + ch_dim3));
    ch -= ch_offset;

    /* Function Body */
    ipp2 = *ip + 2;
    ipph = (*ip + 1) / 2;
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	ch1[(ki + ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 1];
	ch1[(ki + ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 2];
/* L110: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 1] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 1]
		    ;
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 1] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    1];
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 2] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 2]
		    ;
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    2];
/* L112: */
	}
/* L111: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    cc1[(ki + cc1_dim2) * cc1_dim1 + 1] += ch1[(ki + j * ch1_dim2) *
		    ch1_dim1 + 1];
	    cc1[(ki + cc1_dim2) * cc1_dim1 + 2] += ch1[(ki + j * ch1_dim2) *
		    ch1_dim1 + 2];
/* L117: */
	}
/* L118: */
    }
    i__1 = ipph;
    for (l = 2; l <= i__1; ++l) {
	lc = ipp2 - l;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    cc1[(ki + l * cc1_dim2) * cc1_dim1 + 1] = ch1[(ki + ch1_dim2) *
		    ch1_dim1 + 1] + wa[(l - 1 + wa_dim2) * wa_dim1 + 1] * ch1[
		    (ki + (ch1_dim2 << 1)) * ch1_dim1 + 1];
	    cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 1] = -wa[(l - 1 + (wa_dim2
		    << 1)) * wa_dim1 + 1] * ch1[(ki + *ip * ch1_dim2) *
		    ch1_dim1 + 1];
	    cc1[(ki + l * cc1_dim2) * cc1_dim1 + 2] = ch1[(ki + ch1_dim2) *
		    ch1_dim1 + 2] + wa[(l - 1 + wa_dim2) * wa_dim1 + 1] * ch1[
		    (ki + (ch1_dim2 << 1)) * ch1_dim1 + 2];
	    cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 2] = -wa[(l - 1 + (wa_dim2
		    << 1)) * wa_dim1 + 1] * ch1[(ki + *ip * ch1_dim2) *
		    ch1_dim1 + 2];
/* L113: */
	}
	i__2 = ipph;
	for (j = 3; j <= i__2; ++j) {
	    jc = ipp2 - j;
	    idlj = (l - 1) * (j - 1) % *ip;
	    war = wa[(idlj + wa_dim2) * wa_dim1 + 1];
	    wai = -wa[(idlj + (wa_dim2 << 1)) * wa_dim1 + 1];
	    i__3 = *lid;
	    for (ki = 1; ki <= i__3; ++ki) {
		cc1[(ki + l * cc1_dim2) * cc1_dim1 + 1] += war * ch1[(ki + j *
			 ch1_dim2) * ch1_dim1 + 1];
		cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 1] += wai * ch1[(ki +
			jc * ch1_dim2) * ch1_dim1 + 1];
		cc1[(ki + l * cc1_dim2) * cc1_dim1 + 2] += war * ch1[(ki + j *
			 ch1_dim2) * ch1_dim1 + 2];
		cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 2] += wai * ch1[(ki +
			jc * ch1_dim2) * ch1_dim1 + 2];
/* L114: */
	    }
/* L115: */
	}
/* L116: */
    }
    if (*ido > 1) {
	goto L136;
    }
    sn = 1.0 / (fft_real_t) (*ip * *l1);
    if (*na == 1) {
	goto L146;
    }
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	cc1[(ki + cc1_dim2) * cc1_dim1 + 1] = sn * cc1[(ki + cc1_dim2) *
		cc1_dim1 + 1];
	cc1[(ki + cc1_dim2) * cc1_dim1 + 2] = sn * cc1[(ki + cc1_dim2) *
		cc1_dim1 + 2];
/* L149: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    chold1 = sn * (cc1[(ki + j * cc1_dim2) * cc1_dim1 + 1] - cc1[(ki
		    + jc * cc1_dim2) * cc1_dim1 + 2]);
	    chold2 = sn * (cc1[(ki + j * cc1_dim2) * cc1_dim1 + 1] + cc1[(ki
		    + jc * cc1_dim2) * cc1_dim1 + 2]);
	    cc1[(ki + j * cc1_dim2) * cc1_dim1 + 1] = chold1;
	    cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 2] = sn * (cc1[(ki + j *
		    cc1_dim2) * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) *
		    cc1_dim1 + 1]);
	    cc1[(ki + j * cc1_dim2) * cc1_dim1 + 2] = sn * (cc1[(ki + j *
		    cc1_dim2) * cc1_dim1 + 2] + cc1[(ki + jc * cc1_dim2) *
		    cc1_dim1 + 1]);
	    cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 1] = chold2;
/* L119: */
	}
/* L120: */
    }
    return 0;
L146:
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	ch1[(ki + ch1_dim2) * ch1_dim1 + 1] = sn * cc1[(ki + cc1_dim2) *
		cc1_dim1 + 1];
	ch1[(ki + ch1_dim2) * ch1_dim1 + 2] = sn * cc1[(ki + cc1_dim2) *
		cc1_dim1 + 2];
/* L147: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 1] = sn * (cc1[(ki + j *
		    cc1_dim2) * cc1_dim1 + 1] - cc1[(ki + jc * cc1_dim2) *
		    cc1_dim1 + 2]);
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 2] = sn * (cc1[(ki + j *
		    cc1_dim2) * cc1_dim1 + 2] + cc1[(ki + jc * cc1_dim2) *
		    cc1_dim1 + 1]);
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 1] = sn * (cc1[(ki + j *
		    cc1_dim2) * cc1_dim1 + 1] + cc1[(ki + jc * cc1_dim2) *
		    cc1_dim1 + 2]);
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 2] = sn * (cc1[(ki + j *
		    cc1_dim2) * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) *
		    cc1_dim1 + 1]);
/* L144: */
	}
/* L145: */
    }
    return 0;
L136:
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	ch1[(ki + ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 1];
	ch1[(ki + ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 2];
/* L137: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 1] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 2]
		    ;
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 2] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 1]
		    ;
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 1] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    2];
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    1];
/* L134: */
	}
/* L135: */
    }
    i__1 = *ido;
    for (i__ = 1; i__ <= i__1; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    cc[(k + (i__ * cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] = ch[(k + (
		    i__ + ch_dim3) * ch_dim2) * ch_dim1 + 1];
	    cc[(k + (i__ * cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] = ch[(k + (
		    i__ + ch_dim3) * ch_dim2) * ch_dim1 + 2];
/* L130: */
	}
/* L131: */
    }
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    cc[(k + (j + cc_dim3) * cc_dim2) * cc_dim1 + 1] = ch[(k + (j *
		    ch_dim3 + 1) * ch_dim2) * ch_dim1 + 1];
	    cc[(k + (j + cc_dim3) * cc_dim2) * cc_dim1 + 2] = ch[(k + (j *
		    ch_dim3 + 1) * ch_dim2) * ch_dim1 + 2];
/* L122: */
	}
/* L123: */
    }
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *ido;
	for (i__ = 2; i__ <= i__2; ++i__) {
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		cc[(k + (j + i__ * cc_dim3) * cc_dim2) * cc_dim1 + 1] = wa[
			i__ + (j - 1 + wa_dim2) * wa_dim1] * ch[(k + (i__ + j
			* ch_dim3) * ch_dim2) * ch_dim1 + 1] + wa[i__ + (j -
			1 + (wa_dim2 << 1)) * wa_dim1] * ch[(k + (i__ + j *
			ch_dim3) * ch_dim2) * ch_dim1 + 2];
		cc[(k + (j + i__ * cc_dim3) * cc_dim2) * cc_dim1 + 2] = wa[
			i__ + (j - 1 + wa_dim2) * wa_dim1] * ch[(k + (i__ + j
			* ch_dim3) * ch_dim2) * ch_dim1 + 2] - wa[i__ + (j -
			1 + (wa_dim2 << 1)) * wa_dim1] * ch[(k + (i__ + j *
			ch_dim3) * ch_dim2) * ch_dim1 + 1];
/* L124: */
	    }
/* L125: */
	}
/* L126: */
    }
    return 0;
}